

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void launch(void)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  char *str;
  char **x;
  char **__argv;
  int *piVar3;
  ulong uVar4;
  
  pcVar2 = require_environment("APPDIR_EXEC_PATH");
  str = require_environment("APPDIR_EXEC_ARGS");
  x = apprun_shell_split_arguments(str);
  uVar1 = apprun_string_list_len(x);
  __argv = (char **)calloc((ulong)(uVar1 + 2),8);
  *__argv = pcVar2;
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      __argv[uVar4 + 1] = x[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  execv(pcVar2,__argv);
  __stream = _stderr;
  piVar3 = __errno_location();
  pcVar2 = strerror(*piVar3);
  fprintf(__stream,"APPRUN_ERROR: %s",pcVar2);
  return;
}

Assistant:

void launch() {
    char *exec_path = require_environment(APPDIR_EXEC_PATH_ENV);
    char *exec_args = require_environment(APPDIR_EXEC_ARGS_ENV);

    char **user_args = apprun_shell_split_arguments(exec_args);
    unsigned user_args_len = apprun_string_list_len(user_args);
    char **argv = calloc(user_args_len + 2, sizeof(char *));
    argv[0] = exec_path;
    for (int i = 0; i < user_args_len; i++)
        argv[i + 1] = user_args[i];

#ifdef DEBUG
    fprintf(stderr, "APPRUN_DEBUG: executing ");
    for (char **itr = argv; itr != NULL && *itr != NULL; itr++)
        fprintf(stderr, "\"%s\" ", *itr);
    fprintf(stderr, "\n");
#endif
    int ret = execv(exec_path, argv);
    fprintf(stderr, "APPRUN_ERROR: %s", strerror(errno));
}